

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddTargetAlias
          (cmGlobalNinjaGenerator *this,string *alias,cmGeneratorTarget *target,string *config)

{
  string *__return_storage_ptr__;
  bool bVar1;
  reference __k;
  mapped_type *pmVar2;
  reference this_00;
  pointer this_01;
  pointer ppVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TargetAlias>_>::value,_pair<iterator,_bool>_>
  _Var6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  local_238;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
  local_1f0;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TargetAlias>_>::value,_pair<iterator,_bool>_>
  newAliasDefaultGlobal;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  local_1d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
  local_188;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TargetAlias>_>::value,_pair<iterator,_bool>_>
  newAliasConfig;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  local_168;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
  local_120;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TargetAlias>_>::value,_pair<iterator,_bool>_>
  newAliasGlobal;
  TargetAlias ta;
  string *config2;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *output;
  iterator __end1;
  iterator __begin1;
  cmNinjaDeps *__range1;
  cmNinjaDeps outputs;
  undefined1 local_68 [8];
  string buildAlias;
  string outputPath;
  string *config_local;
  cmGeneratorTarget *target_local;
  string *alias_local;
  cmGlobalNinjaGenerator *this_local;
  
  __return_storage_ptr__ = (string *)((long)&buildAlias.field_2 + 8);
  NinjaOutputPath(__return_storage_ptr__,this,alias);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
            (local_68,this,__return_storage_ptr__,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  bVar1 = std::operator!=(config,"all");
  if (bVar1) {
    AppendTargetOutputs(this,target,(cmNinjaDeps *)&__range1,config,DependOnTargetArtifact);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  output = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&output), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
             ::operator[](&this->TargetAliases,__k);
    pmVar2->GeneratorTarget = (cmGeneratorTarget *)0x0;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
             ::operator[](&this->DefaultTargetAliases,__k);
    pmVar2->GeneratorTarget = (cmGeneratorTarget *)0x0;
    this_00 = std::
              vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
              ::front(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles);
    this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin2,this_01,IncludeEmptyConfig);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin2);
    config2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config2), bVar1) {
      ta.Config.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
               ::operator[](&this->Configs,(key_type *)ta.Config.field_2._8_8_);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
               ::operator[](&pmVar4->TargetAliases,__k);
      pmVar2->GeneratorTarget = (cmGeneratorTarget *)0x0;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__begin2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  TargetAlias::TargetAlias((TargetAlias *)&newAliasGlobal.second);
  newAliasGlobal._8_8_ = target;
  std::__cxx11::string::operator=((string *)&ta,(string *)config);
  std::make_pair<std::__cxx11::string&,cmGlobalNinjaGenerator::TargetAlias&>
            (&local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (TargetAlias *)&newAliasGlobal.second);
  _Var6 = std::
          map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::insert<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&this->TargetAliases,&local_168);
  newAliasConfig._8_8_ = _Var6.first._M_node;
  newAliasGlobal.first._M_node._0_1_ = _Var6.second;
  local_120._M_node = (_Base_ptr)newAliasConfig._8_8_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::~pair(&local_168);
  if ((((byte)newAliasGlobal.first._M_node & 1) != 0) &&
     (ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
               ::operator->(&local_120), (ppVar3->second).GeneratorTarget != target)) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
             ::operator->(&local_120);
    (ppVar3->second).GeneratorTarget = (cmGeneratorTarget *)0x0;
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  std::make_pair<std::__cxx11::string&,cmGlobalNinjaGenerator::TargetAlias&>
            (&local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&buildAlias.field_2 + 8),(TargetAlias *)&newAliasGlobal.second);
  _Var6 = std::
          map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::insert<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&pmVar4->TargetAliases,&local_1d0);
  newAliasDefaultGlobal._8_8_ = _Var6.first._M_node;
  newAliasConfig.first._M_node._0_1_ = _Var6.second;
  local_188._M_node = (_Base_ptr)newAliasDefaultGlobal._8_8_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::~pair(&local_1d0);
  if ((((byte)newAliasConfig.first._M_node & 1) != 0) &&
     (ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
               ::operator->(&local_188), (ppVar3->second).GeneratorTarget != target)) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
             ::operator->(&local_188);
    (ppVar3->second).GeneratorTarget = (cmGeneratorTarget *)0x0;
  }
  sVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->DefaultConfigs,config);
  if (sVar5 != 0) {
    std::make_pair<std::__cxx11::string&,cmGlobalNinjaGenerator::TargetAlias&>
              (&local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&buildAlias.field_2 + 8),(TargetAlias *)&newAliasGlobal.second);
    _Var6 = std::
            map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
            ::insert<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                      ((map<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                        *)&this->DefaultTargetAliases,&local_238);
    local_1f0 = _Var6.first._M_node;
    newAliasDefaultGlobal.first._M_node._0_1_ = _Var6.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
    ::~pair(&local_238);
    if ((((byte)newAliasDefaultGlobal.first._M_node & 1) != 0) &&
       (ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
                 ::operator->(&local_1f0), (ppVar3->second).GeneratorTarget != target)) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>
               ::operator->(&local_1f0);
      (ppVar3->second).GeneratorTarget = (cmGeneratorTarget *)0x0;
    }
  }
  TargetAlias::~TargetAlias((TargetAlias *)&newAliasGlobal.second);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(buildAlias.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddTargetAlias(const std::string& alias,
                                            cmGeneratorTarget* target,
                                            const std::string& config)
{
  std::string outputPath = this->NinjaOutputPath(alias);
  std::string buildAlias = this->BuildAlias(outputPath, config);
  cmNinjaDeps outputs;
  if (config != "all") {
    this->AppendTargetOutputs(target, outputs, config, DependOnTargetArtifact);
  }
  // Mark the target's outputs as ambiguous to ensure that no other target
  // uses the output as an alias.
  for (std::string const& output : outputs) {
    this->TargetAliases[output].GeneratorTarget = nullptr;
    this->DefaultTargetAliases[output].GeneratorTarget = nullptr;
    for (const std::string& config2 :
         this->Makefiles.front()->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->Configs[config2].TargetAliases[output].GeneratorTarget = nullptr;
    }
  }

  // Insert the alias into the map.  If the alias was already present in the
  // map and referred to another target, mark it as ambiguous.
  TargetAlias ta;
  ta.GeneratorTarget = target;
  ta.Config = config;

  auto newAliasGlobal =
    this->TargetAliases.insert(std::make_pair(buildAlias, ta));
  if (newAliasGlobal.second &&
      newAliasGlobal.first->second.GeneratorTarget != target) {
    newAliasGlobal.first->second.GeneratorTarget = nullptr;
  }

  auto newAliasConfig =
    this->Configs[config].TargetAliases.insert(std::make_pair(outputPath, ta));
  if (newAliasConfig.second &&
      newAliasConfig.first->second.GeneratorTarget != target) {
    newAliasConfig.first->second.GeneratorTarget = nullptr;
  }
  if (this->DefaultConfigs.count(config)) {
    auto newAliasDefaultGlobal =
      this->DefaultTargetAliases.insert(std::make_pair(outputPath, ta));
    if (newAliasDefaultGlobal.second &&
        newAliasDefaultGlobal.first->second.GeneratorTarget != target) {
      newAliasDefaultGlobal.first->second.GeneratorTarget = nullptr;
    }
  }
}